

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::ResumeIdleDecommitNonLeaf(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachNonLeafPageAllocator<Memory::HeapInfo::ResumeIdleDecommitNonLeaf()::__0>(this);
  return;
}

Assistant:

void HeapInfo::ResumeIdleDecommitNonLeaf()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->ResumeIdleDecommit();
    });
}